

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ptr<Expression> __thiscall Parser::memberAccess(Parser *this,ptr<Expression> *callee)

{
  shared_ptr<Expression> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Expression> pVar1;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> _Stack_68;
  undefined1 local_58 [32];
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  consume((Parser *)callee);
  variable((Parser *)local_58);
  std::make_shared<MemberAccess,std::shared_ptr<Expression>&,std::shared_ptr<Expression>&>
            ((shared_ptr<Expression> *)(local_58 + 0x10),in_RDX);
  local_38._M_ptr = (element_type *)local_58._16_8_;
  local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._24_8_;
  local_58._16_8_ = 0;
  local_58._24_8_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&_Stack_68,&local_38);
  postfix(this,callee);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_68._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  pVar1.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar1.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::memberAccess(ptr<Expression> callee) {
    consume();
    ptr<Expression> expr = make<MemberAccess>(callee, variable());
    return postfix(expr);
}